

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListDelete(sqlite3 *db,SrcList *pList)

{
  SrcList_item *local_28;
  SrcList_item *pItem;
  int i;
  SrcList *pList_local;
  sqlite3 *db_local;
  
  if (pList != (SrcList *)0x0) {
    local_28 = pList->a;
    for (pItem._4_4_ = 0; pItem._4_4_ < pList->nSrc; pItem._4_4_ = pItem._4_4_ + 1) {
      sqlite3DbFree(db,local_28->zDatabase);
      sqlite3DbFree(db,local_28->zName);
      sqlite3DbFree(db,local_28->zAlias);
      if (((byte)(local_28->fg).field_0x1 >> 1 & 1) != 0) {
        sqlite3DbFree(db,(local_28->u1).zIndexedBy);
      }
      if (((byte)(local_28->fg).field_0x1 >> 2 & 1) != 0) {
        sqlite3ExprListDelete(db,(local_28->u1).pFuncArg);
      }
      sqlite3DeleteTable(db,local_28->pTab);
      sqlite3SelectDelete(db,local_28->pSelect);
      sqlite3ExprDelete(db,local_28->pOn);
      sqlite3IdListDelete(db,local_28->pUsing);
      local_28 = local_28 + 1;
    }
    sqlite3DbFreeNN(db,pList);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListDelete(sqlite3 *db, SrcList *pList){
  int i;
  struct SrcList_item *pItem;
  if( pList==0 ) return;
  for(pItem=pList->a, i=0; i<pList->nSrc; i++, pItem++){
    sqlite3DbFree(db, pItem->zDatabase);
    sqlite3DbFree(db, pItem->zName);
    sqlite3DbFree(db, pItem->zAlias);
    if( pItem->fg.isIndexedBy ) sqlite3DbFree(db, pItem->u1.zIndexedBy);
    if( pItem->fg.isTabFunc ) sqlite3ExprListDelete(db, pItem->u1.pFuncArg);
    sqlite3DeleteTable(db, pItem->pTab);
    sqlite3SelectDelete(db, pItem->pSelect);
    sqlite3ExprDelete(db, pItem->pOn);
    sqlite3IdListDelete(db, pItem->pUsing);
  }
  sqlite3DbFreeNN(db, pList);
}